

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPUDPv6Transmitter::ProcessDeleteAcceptIgnoreEntry
          (RTPUDPv6Transmitter *this,in6_addr ip,uint16_t port)

{
  PortInfo *pPVar1;
  bool bVar2;
  PortInfo **ppPVar3;
  reference puVar4;
  reference puVar5;
  const_iterator local_a8;
  _List_node_base *local_a0;
  _List_node_base *local_98;
  _List_iterator<unsigned_short> local_90;
  iterator end_1;
  iterator begin_1;
  iterator it_1;
  iterator local_70;
  _List_const_iterator<unsigned_short> local_68;
  iterator local_60;
  _List_const_iterator<unsigned_short> local_58;
  _List_const_iterator<unsigned_short> local_50;
  const_iterator end;
  const_iterator begin;
  const_iterator it;
  PortInfo *inf;
  RTPUDPv6Transmitter *pRStack_28;
  uint16_t port_local;
  RTPUDPv6Transmitter *this_local;
  in6_addr ip_local;
  
  ip_local.__in6_u._0_8_ = ip.__in6_u._8_8_;
  register0x00000030 = ip.__in6_u._0_8_;
  inf._6_2_ = port;
  pRStack_28 = this;
  RTPKeyHashTable<const_in6_addr,_jrtplib::RTPUDPv6Transmitter::PortInfo_*,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>
  ::GotoElement(&this->acceptignoreinfo,(in6_addr *)((long)&this_local + 4));
  bVar2 = RTPKeyHashTable<const_in6_addr,_jrtplib::RTPUDPv6Transmitter::PortInfo_*,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>
          ::HasCurrentElement(&this->acceptignoreinfo);
  if (bVar2) {
    ppPVar3 = RTPKeyHashTable<const_in6_addr,_jrtplib::RTPUDPv6Transmitter::PortInfo_*,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>
              ::GetCurrentElement(&this->acceptignoreinfo);
    pPVar1 = *ppPVar3;
    if (inf._6_2_ == 0) {
      pPVar1->all = false;
      std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::clear(&pPVar1->portlist);
    }
    else {
      if ((pPVar1->all & 1U) == 0) {
        std::_List_iterator<unsigned_short>::_List_iterator(&begin_1);
        std::_List_iterator<unsigned_short>::_List_iterator(&end_1);
        std::_List_iterator<unsigned_short>::_List_iterator(&local_90);
        local_98 = (_List_node_base *)
                   std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::begin
                             (&pPVar1->portlist);
        end_1._M_node = local_98;
        local_a0 = (_List_node_base *)
                   std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::end
                             (&pPVar1->portlist);
        begin_1 = end_1;
        local_90._M_node = local_a0;
        while( true ) {
          bVar2 = std::operator!=(&begin_1,&local_90);
          if (!bVar2) {
            return -0x6f;
          }
          puVar5 = std::_List_iterator<unsigned_short>::operator*(&begin_1);
          if (*puVar5 == inf._6_2_) break;
          std::_List_iterator<unsigned_short>::operator++(&begin_1);
        }
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_a8,&begin_1);
        std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::erase
                  (&pPVar1->portlist,local_a8);
        return 0;
      }
      std::_List_const_iterator<unsigned_short>::_List_const_iterator(&begin);
      std::_List_const_iterator<unsigned_short>::_List_const_iterator(&end);
      std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_50);
      local_60._M_node =
           (_List_node_base *)
           std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::begin
                     (&pPVar1->portlist);
      std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_58,&local_60);
      end._M_node = local_58._M_node;
      local_70._M_node =
           (_List_node_base *)
           std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::end
                     (&pPVar1->portlist);
      std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_68,&local_70);
      local_50._M_node = local_68._M_node;
      begin = end;
      while (bVar2 = std::operator!=(&begin,&local_50), bVar2) {
        puVar4 = std::_List_const_iterator<unsigned_short>::operator*(&begin);
        if (*puVar4 == inf._6_2_) {
          return -0x6f;
        }
        std::_List_const_iterator<unsigned_short>::operator++(&begin,0);
      }
      std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::push_front
                (&pPVar1->portlist,(value_type_conflict2 *)((long)&inf + 6));
    }
    ip_local.__in6_u.__u6_addr32[2] = 0;
  }
  else {
    ip_local.__in6_u.__u6_addr32[2] = 0xffffff91;
  }
  return ip_local.__in6_u.__u6_addr32[2];
}

Assistant:

int RTPUDPv6Transmitter::ProcessDeleteAcceptIgnoreEntry(in6_addr ip,uint16_t port)
{
	acceptignoreinfo.GotoElement(ip);
	if (!acceptignoreinfo.HasCurrentElement())
		return ERR_RTP_UDPV6TRANS_NOSUCHENTRY;
	
	PortInfo *inf;

	inf = acceptignoreinfo.GetCurrentElement();
	if (port == 0) // delete all entries
	{
		inf->all = false;
		inf->portlist.clear();
	}
	else // a specific port was selected
	{
		if (inf->all) // currently, all ports are selected. Add the one to remove to the list
		{
			// we have to check if the list doesn't contain the port already
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == port) // already in list: this means we already deleted the entry
					return ERR_RTP_UDPV6TRANS_NOSUCHENTRY;
			}
			inf->portlist.push_front(port);
		}
		else // check if we can find the port in the list
		{
			std::list<uint16_t>::iterator it,begin,end;
			
			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; ++it)
			{
				if (*it == port) // found it!
				{
					inf->portlist.erase(it);
					return 0;
				}
			}
			// didn't find it
			return ERR_RTP_UDPV6TRANS_NOSUCHENTRY;			
		}
	}
	return 0;
}